

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureCommand.cxx
# Opt level: O2

void __thiscall cmCTestConfigureCommand::cmCTestConfigureCommand(cmCTestConfigureCommand *this)

{
  cmCTestHandlerCommand::cmCTestHandlerCommand(&this->super_cmCTestHandlerCommand);
  (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestHandlerCommand_0063b6c0;
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[7] = "OPTIONS";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[8] = (char *)0x0;
  (this->super_cmCTestHandlerCommand).Last = 8;
  return;
}

Assistant:

cmCTestConfigureCommand::cmCTestConfigureCommand()
{
  this->Arguments[ctc_OPTIONS] = "OPTIONS";
  this->Arguments[ctc_LAST] = nullptr;
  this->Last = ctc_LAST;
}